

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O1

void gf_25519_mul(gf_25519_s *cs,gf_25519_s *as,gf_25519_s *bs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint64_t hi_2;
  ulong uVar55;
  uint64_t lo;
  uint64_t lo_2;
  ulong uVar56;
  uint64_t hi;
  ulong uVar57;
  uint64_t hi_1;
  ulong uVar58;
  uint64_t lo_1;
  
  uVar57 = as->limb[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar57;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = bs->limb[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar57;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = bs->limb[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar57;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = bs->limb[2];
  uVar57 = as->limb[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar57;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = bs->limb[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar57;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = bs->limb[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar57 * 0x13;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = bs->limb[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = as->limb[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = bs->limb[0];
  uVar57 = as->limb[2] * 0x13;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar57;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = bs->limb[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar57;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = bs->limb[4];
  uVar57 = as->limb[3] * 0x13;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar57;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = bs->limb[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar57;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = bs->limb[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar57;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = bs->limb[4];
  uVar57 = as->limb[4] * 0x13;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar57;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = bs->limb[1];
  auVar1 = auVar6 * auVar31 + auVar1 * auVar26 + auVar8 * auVar33 + auVar10 * auVar35 +
           auVar13 * auVar38;
  uVar56 = auVar1._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar57;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = bs->limb[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar57;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = bs->limb[3];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar1._8_8_ << 0xd | uVar56 >> 0x33;
  auVar52 = auVar5 * auVar30 + auVar2 * auVar27 + auVar9 * auVar34 + auVar11 * auVar36 +
            auVar14 * auVar39 + auVar52;
  uVar55 = auVar52._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar52._8_8_ << 0xd | uVar55 >> 0x33;
  auVar53 = auVar4 * auVar29 + auVar3 * auVar28 + auVar7 * auVar32 + auVar12 * auVar37 +
            auVar15 * auVar40 + auVar53;
  uVar58 = auVar53._0_8_;
  cs->limb[2] = uVar58 & 0x7ffffffffffff;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar53._8_8_ << 0xd | uVar58 >> 0x33;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar57;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = bs->limb[4];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = as->limb[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = bs->limb[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = as->limb[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = bs->limb[4];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = as->limb[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = bs->limb[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = as->limb[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = bs->limb[3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = as->limb[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = bs->limb[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = as->limb[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = bs->limb[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = as->limb[3];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = bs->limb[0];
  auVar1 = auVar16 * auVar41 + auVar51 + auVar17 * auVar42 + auVar19 * auVar44 + auVar21 * auVar46 +
           auVar23 * auVar48;
  uVar57 = auVar1._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = as->limb[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = bs->limb[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar1._8_8_ << 0xd | uVar57 >> 0x33;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = as->limb[4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = bs->limb[0];
  cs->limb[3] = uVar57 & 0x7ffffffffffff;
  auVar54 = auVar20 * auVar45 + auVar18 * auVar43 + auVar22 * auVar47 + auVar24 * auVar49 +
            auVar25 * auVar50 + auVar54;
  uVar57 = auVar54._0_8_;
  cs->limb[4] = uVar57 & 0x7ffffffffffff;
  uVar57 = (auVar54._8_8_ << 0xd | uVar57 >> 0x33) * 0x13 + (uVar56 & 0x7ffffffffffff);
  cs->limb[0] = uVar57 & 0x7ffffffffffff;
  cs->limb[1] = (uVar55 & 0x7ffffffffffff) + (uVar57 >> 0x33);
  return;
}

Assistant:

void gf_mul (gf_s *__restrict__ cs, const gf as, const gf bs) {
    const uint64_t *a = as->limb, *b = bs->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;
    
    __uint128_t accum0, accum1, accum2;
    
    uint64_t ai = a[0];
    accum0 = widemul_rm(ai, &b[0]);
    accum1 = widemul_rm(ai, &b[1]);
    accum2 = widemul_rm(ai, &b[2]);
    
    ai = a[1];
    mac_rm(&accum2, ai, &b[1]);
    mac_rm(&accum1, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[2];
    mac_rm(&accum2, ai, &b[0]);
    ai *= 19;
    mac_rm(&accum0, ai, &b[3]);
    mac_rm(&accum1, ai, &b[4]);
    
    ai = a[3] * 19;
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    mac_rm(&accum2, ai, &b[4]);
    
    ai = a[4] * 19;
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    mac_rm(&accum2, ai, &b[3]);
    
    uint64_t c0 = accum0 & mask;
    accum1 += shrld(accum0, 51);
    uint64_t c1 = accum1 & mask;
    accum2 += shrld(accum1, 51);
    c[2] = accum2 & mask;
    
    accum0 = shrld(accum2, 51);

    mac_rm(&accum0, ai, &b[4]);
    
    ai = a[0];
    mac_rm(&accum0, ai, &b[3]);
    accum1 = widemul_rm(ai, &b[4]);
    
    ai = a[1];
    mac_rm(&accum0, ai, &b[2]);
    mac_rm(&accum1, ai, &b[3]);
    
    ai = a[2];
    mac_rm(&accum0, ai, &b[1]);
    mac_rm(&accum1, ai, &b[2]);
    
    ai = a[3];
    mac_rm(&accum0, ai, &b[0]);
    mac_rm(&accum1, ai, &b[1]);
    
    ai = a[4];
    mac_rm(&accum1, ai, &b[0]);
    /* Here accum1 < 5*(9*2^51)^2 */
    
    c[3] = accum0 & mask;
    accum1 += shrld(accum0, 51);
    c[4] = accum1 & mask;
    
    uint64_t a1 = shrld(accum1,51);
    /* Here a1 < (5*(9*2^51)^2 + small) >> 51 = 405 * 2^51 + small
     * a1 * 19 + c0 < (405*19+1)*2^51 + small < 2^13 * 2^51.
     */
    accum1 = a1 * 19 + c0;
    c[0] = accum1 & mask;
    c[1] = c1 + (accum1>>51);
}